

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramAnalyzeEntropyBin(VP8LHistogramSet *image_histo,uint16_t *bin_map,int low_effort)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_RSI;
  int *in_RDI;
  DominantCostRange cost_range;
  int histo_size;
  VP8LHistogram **histograms;
  int i;
  int in_stack_ffffffffffffffb4;
  DominantCostRange *in_stack_ffffffffffffffb8;
  VP8LHistogram *in_stack_ffffffffffffffc0;
  int local_18;
  
  lVar2 = *(long *)(in_RDI + 2);
  iVar1 = *in_RDI;
  DominantCostRangeInit((DominantCostRange *)&stack0xffffffffffffffa8);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    if (*(long *)(lVar2 + (long)local_18 * 8) != 0) {
      UpdateDominantCostRange
                (*(VP8LHistogram **)(lVar2 + (long)local_18 * 8),
                 (DominantCostRange *)&stack0xffffffffffffffa8);
    }
  }
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    if (*(long *)(lVar2 + (long)local_18 * 8) != 0) {
      iVar3 = GetHistoBinIndex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                               in_stack_ffffffffffffffb4);
      *(short *)(in_RSI + (long)local_18 * 2) = (short)iVar3;
    }
  }
  return;
}

Assistant:

static void HistogramAnalyzeEntropyBin(VP8LHistogramSet* const image_histo,
                                       uint16_t* const bin_map,
                                       int low_effort) {
  int i;
  VP8LHistogram** const histograms = image_histo->histograms;
  const int histo_size = image_histo->size;
  DominantCostRange cost_range;
  DominantCostRangeInit(&cost_range);

  // Analyze the dominant (literal, red and blue) entropy costs.
  for (i = 0; i < histo_size; ++i) {
    if (histograms[i] == NULL) continue;
    UpdateDominantCostRange(histograms[i], &cost_range);
  }

  // bin-hash histograms on three of the dominant (literal, red and blue)
  // symbol costs and store the resulting bin_id for each histogram.
  for (i = 0; i < histo_size; ++i) {
    // bin_map[i] is not set to a special value as its use will later be guarded
    // by another (histograms[i] == NULL).
    if (histograms[i] == NULL) continue;
    bin_map[i] = GetHistoBinIndex(histograms[i], &cost_range, low_effort);
  }
}